

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int run_filters(archive_read *a)

{
  int iVar1;
  rar_program_code *prVar2;
  bool bVar3;
  int local_5c;
  uint local_58;
  int ret;
  uint32_t lastfilterlength;
  uint32_t lastfilteraddress;
  int64_t tend;
  size_t end;
  size_t start;
  rar_filter *f;
  rar_filter *filter;
  rar_filters *filters;
  rar *rar;
  archive_read *a_local;
  
  filters = (rar_filters *)a->format->data;
  filter = (rar_filter *)&filters[0xe].stack;
  f = *(rar_filter **)&filters[0xe].lastfilternum;
  if ((filter != (rar_filter *)0x0) && (f != (rar_filter *)0x0)) {
    end = filters[0xe].lastend;
    _lastfilterlength = end + f->blocklength;
    filters[0xe].lastend = 0x7fffffffffffffff;
    tend = _lastfilterlength;
    rar = (rar *)a;
    iVar1 = expand(a,(int64_t *)&lastfilterlength);
    if (iVar1 == 0) {
      local_5c = -0x1e;
      for (start = *(size_t *)(filter->initialregisters + 2); start != 0;
          start = *(size_t *)(start + 0x50)) {
        if ((rar_filter *)start == f) {
          local_5c = 0;
          break;
        }
      }
      if (((local_5c == 0) && (-1 < _lastfilterlength)) &&
         (tend = _lastfilterlength, _lastfilterlength == end + f->blocklength)) {
        if (filter->prog == (rar_program_code *)0x0) {
          prVar2 = (rar_program_code *)calloc(1,0x40024);
          filter->prog = prVar2;
          if (filter->prog == (rar_program_code *)0x0) {
            return 0;
          }
        }
        iVar1 = copy_from_lzss_window
                          ((archive_read *)rar,&filter->prog->fingerprint,end,f->blocklength);
        if ((iVar1 == 0) &&
           (iVar1 = execute_filter((archive_read *)rar,f,(rar_virtual_machine *)filter->prog,
                                   filters[2].bytes_ready), iVar1 != 0)) {
          ret = f->filteredblockaddress;
          local_58 = f->filteredblocklength;
          *(rar_filter **)(filter->initialregisters + 2) = f->next;
          f->next = (rar_filter *)0x0;
          delete_filter(f);
          while( true ) {
            f = *(rar_filter **)(filter->initialregisters + 2);
            bVar3 = false;
            if ((f != (rar_filter *)0x0) &&
               (bVar3 = false, f->blockstartpos == *(size_t *)(filter->initialregisters + 4))) {
              bVar3 = f->blocklength == local_58;
            }
            if (!bVar3) {
              if (*(long *)(filter->initialregisters + 2) != 0) {
                if (*(ulong *)(*(long *)(filter->initialregisters + 2) + 0x38) < (ulong)tend) {
                  return 0;
                }
                *(undefined8 *)(filter->initialregisters + 4) =
                     *(undefined8 *)(*(long *)(filter->initialregisters + 2) + 0x38);
              }
              filter->globaldata = (uint8_t *)tend;
              *(ulong *)&filter->globaldatalen = (long)&filter->prog->fingerprint + (ulong)(uint)ret
              ;
              filter->blockstartpos = (ulong)local_58;
              return 1;
            }
            memmove(&filter->prog->fingerprint,
                    (void *)((long)&filter->prog->fingerprint + (ulong)(uint)ret),(ulong)local_58);
            iVar1 = execute_filter((archive_read *)rar,f,(rar_virtual_machine *)filter->prog,
                                   filters[2].bytes_ready);
            if (iVar1 == 0) break;
            ret = f->filteredblockaddress;
            local_58 = f->filteredblocklength;
            *(rar_filter **)(filter->initialregisters + 2) = f->next;
            f->next = (rar_filter *)0x0;
            delete_filter(f);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
run_filters(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_filters *filters = &rar->filters;
  struct rar_filter *filter = filters->stack;
  struct rar_filter *f;
  size_t start, end;
  int64_t tend;
  uint32_t lastfilteraddress;
  uint32_t lastfilterlength;
  int ret;

  if (filters == NULL || filter == NULL)
    return (0);

  start = filters->filterstart;
  end = start + filter->blocklength;

  filters->filterstart = INT64_MAX;
  tend = (int64_t)end;
  ret = expand(a, &tend);
  if (ret != ARCHIVE_OK)
    return 0;

  /* Check if filter stack was modified in expand() */
  ret = ARCHIVE_FATAL;
  f = filters->stack;
  while (f)
  {
    if (f == filter)
    {
      ret = ARCHIVE_OK;
      break;
    }
    f = f->next;
  }
  if (ret != ARCHIVE_OK)
    return 0;

  if (tend < 0)
    return 0;
  end = (size_t)tend;
  if (end != start + filter->blocklength)
    return 0;

  if (!filters->vm)
  {
    filters->vm = calloc(1, sizeof(*filters->vm));
    if (!filters->vm)
      return 0;
  }

  ret = copy_from_lzss_window(a, filters->vm->memory, start, filter->blocklength);
  if (ret != ARCHIVE_OK)
    return 0;
  if (!execute_filter(a, filter, filters->vm, rar->offset))
    return 0;

  lastfilteraddress = filter->filteredblockaddress;
  lastfilterlength = filter->filteredblocklength;
  filters->stack = filter->next;
  filter->next = NULL;
  delete_filter(filter);

  while ((filter = filters->stack) != NULL && (int64_t)filter->blockstartpos == filters->filterstart && filter->blocklength == lastfilterlength)
  {
    memmove(&filters->vm->memory[0], &filters->vm->memory[lastfilteraddress], lastfilterlength);
    if (!execute_filter(a, filter, filters->vm, rar->offset))
      return 0;

    lastfilteraddress = filter->filteredblockaddress;
    lastfilterlength = filter->filteredblocklength;
    filters->stack = filter->next;
    filter->next = NULL;
    delete_filter(filter);
  }

  if (filters->stack)
  {
    if (filters->stack->blockstartpos < end)
      return 0;
    filters->filterstart = filters->stack->blockstartpos;
  }

  filters->lastend = end;
  filters->bytes = &filters->vm->memory[lastfilteraddress];
  filters->bytes_ready = lastfilterlength;

  return 1;
}